

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError UTF16BEToUTF8(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  byte bVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  xmlCharEncError local_64;
  int ret;
  uint d;
  uint c;
  uchar *outend;
  uchar *outstart;
  uchar *inend;
  uchar *instart;
  int flush_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  void *vctxt_local;
  
  uVar2 = *inlen;
  piVar6 = (int *)(out + *outlen);
  local_64 = XML_ENC_ERR_SPACE;
  inlen_local = (int *)in;
  outlen_local = (int *)out;
  while( true ) {
    if (in + (int)(uVar2 & 0xfffffffe) <= inlen_local) break;
    bVar1 = *(byte *)((long)inlen_local + 1);
    uVar3 = CONCAT11((byte)*inlen_local,bVar1);
    uVar4 = (uint)uVar3;
    if (uVar4 < 0x80) {
      if (piVar6 <= outlen_local) goto LAB_0012e213;
      *(byte *)outlen_local = bVar1;
      inlen_local = (int *)((long)inlen_local + 2);
      outlen_local = (int *)((long)outlen_local + 1);
    }
    else if (uVar4 < 0x800) {
      if ((long)piVar6 - (long)outlen_local < 2) goto LAB_0012e213;
      *(byte *)outlen_local = (byte)(uVar3 >> 6) | 0xc0;
      *(byte *)((long)outlen_local + 1) = bVar1 & 0x3f | 0x80;
      inlen_local = (int *)((long)inlen_local + 2);
      outlen_local = (int *)((long)outlen_local + 2);
    }
    else if ((uVar4 & 0xf800) == 0xd800) {
      if ((uVar4 & 0xfc00) != 0xd800) {
        local_64 = XML_ENC_ERR_INPUT;
        goto LAB_0012e213;
      }
      if ((long)(in + (int)(uVar2 & 0xfffffffe)) - (long)inlen_local < 4) break;
      uVar5 = (uint)CONCAT11(*(undefined1 *)((long)inlen_local + 2),
                             *(undefined1 *)((long)inlen_local + 3));
      if ((uVar5 & 0xfc00) != 0xdc00) {
        local_64 = XML_ENC_ERR_INPUT;
        goto LAB_0012e213;
      }
      if ((long)piVar6 - (long)outlen_local < 4) goto LAB_0012e213;
      uVar4 = uVar4 * 0x400 + uVar5 + 0xfca02400;
      *(byte *)outlen_local = (byte)(uVar4 >> 0x12) | 0xf0;
      *(byte *)((long)outlen_local + 1) = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
      *(byte *)((long)outlen_local + 2) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
      *(byte *)((long)outlen_local + 3) = (byte)uVar4 & 0x3f | 0x80;
      inlen_local = inlen_local + 1;
      outlen_local = outlen_local + 1;
    }
    else {
      if ((long)piVar6 - (long)outlen_local < 3) goto LAB_0012e213;
      *(byte *)outlen_local = (byte)*inlen_local >> 4 | 0xe0;
      *(byte *)((long)outlen_local + 1) = (byte)(uVar3 >> 6) & 0x3f | 0x80;
      *(byte *)((long)outlen_local + 2) = bVar1 & 0x3f | 0x80;
      inlen_local = (int *)((long)inlen_local + 2);
      outlen_local = (int *)((long)outlen_local + 3);
    }
  }
  local_64 = (int)outlen_local - (int)out;
LAB_0012e213:
  *outlen = (int)outlen_local - (int)out;
  *inlen = (int)inlen_local - (int)in;
  return local_64;
}

Assistant:

static xmlCharEncError
UTF16BEToUTF8(void *vctxt ATTRIBUTE_UNUSED,
              unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              int flush ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend = in + (*inlen & ~1);
    unsigned char *outstart = out;
    unsigned char *outend = out + *outlen;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    while (in < inend) {
        c = (in[0] << 8) | in[1];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = c;
            in += 2;
            out += 1;
        } else if (c < 0x800) {
            if (outend - out < 2)
                goto done;
            out[0] = (c >> 6)   | 0xC0;
            out[1] = (c & 0x3F) | 0x80;
            in += 2;
            out += 2;
        } else if ((c & 0xF800) != 0xD800) {
            if (outend - out < 3)
                goto done;
            out[0] =  (c >> 12)         | 0xE0;
            out[1] = ((c >>  6) & 0x3F) | 0x80;
            out[2] =  (c        & 0x3F) | 0x80;
            in += 2;
            out += 3;
        } else {
            /* Surrogate pair */
            if ((c & 0xFC00) != 0xD800) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (inend - in < 4)
		break;
            d = (in[2] << 8) | in[3];
            if ((d & 0xFC00) != 0xDC00) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }
	    if (outend - out < 4)
		goto done;
            c = (c << 10) + d - ((0xD800 << 10) + 0xDC00 - 0x10000);
            out[0] =  (c >> 18)         | 0xF0;
            out[1] = ((c >> 12) & 0x3F) | 0x80;
            out[2] = ((c >>  6) & 0x3F) | 0x80;
            out[3] =  (c        & 0x3F) | 0x80;
            in += 4;
            out += 4;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}